

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SurfaceDiffusion.cpp
# Opt level: O3

void __thiscall
OpenMD::SurfaceDiffusion::SurfaceDiffusion
          (SurfaceDiffusion *this,SimInfo *info,string *filename,string *sele,RealType param_4)

{
  SelectionEvaluator *this_00;
  pointer pcVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  SelectionSet local_48;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,1);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__SurfaceDiffusion_00337860;
  (this->selectionScript_)._M_dataplus._M_p = (pointer)&(this->selectionScript_).field_2;
  pcVar1 = (sele->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript_,pcVar1,pcVar1 + sele->_M_string_length);
  this_00 = &this->evaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  SelectionManager::SelectionManager(&this->seleMan1_,info);
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  (this->filename_)._M_string_length = 0;
  (this->filename_).field_2._M_local_buf[0] = '\0';
  memset(&this->positions_,0,0x198);
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate(&local_48,this_00);
    lVar4 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan1_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar4),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_48.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar4));
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_48.bitsets_);
  }
  iVar2 = OpenMDBitSet::countBits
                    ((this->seleMan1_).ss_.bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  this->selectionCount_ = iVar2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SelectionCount_: ",0x11)
  ;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->selectionCount_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::resize(&this->moBool_,(long)this->selectionCount_);
  std::
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ::resize(&this->positions_,(long)this->selectionCount_);
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  this->singleMoveDistance_ = 2.0;
  return;
}

Assistant:

SurfaceDiffusion::SurfaceDiffusion(SimInfo* info, const std::string& filename,
                                     const std::string& sele, RealType) :
      StaticAnalyser(info, filename, 1),
      selectionScript_(sele), evaluator_(info), seleMan1_(info) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator_.evaluate());
    }

    // Depending on the selection 'sele1="select Pt"' need a vector equal to the
    // number of Platinums in the system (for this specific case)
    selectionCount_ = seleMan1_.getSelectionCount();
    cout << "SelectionCount_: " << selectionCount_ << "\n";

    moBool_.resize(selectionCount_);
    positions_.resize(selectionCount_);

    filename_           = filename;
    singleMoveDistance_ = 2.0;
  }